

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void cfd::js::api::json::VerifyPsbtSignRequest::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>_>_>,_bool>
  pVar2;
  allocator local_1a1;
  string local_1a0 [32];
  _Base_ptr local_180;
  undefined1 local_178;
  undefined1 local_170 [64];
  function<std::__cxx11::string()> local_130 [39];
  allocator local_109;
  string local_108 [32];
  _Base_ptr local_e8;
  undefined1 local_e0;
  undefined1 local_c8 [64];
  function<std::__cxx11::string()> local_88 [32];
  undefined1 local_68 [8];
  CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest> func_table;
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>_>_>_>
                   *)json_mapper_abi_cxx11_);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>::CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest> *)local_68);
    std::function<std::__cxx11::string(cfd::js::api::json::VerifyPsbtSignRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::VerifyPsbtSignRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::VerifyPsbtSignRequest_const&)> *)
               local_c8,GetPsbtString_abi_cxx11_);
    std::function<void(cfd::js::api::json::VerifyPsbtSignRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::VerifyPsbtSignRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::VerifyPsbtSignRequest&,UniValue_const&)> *)
               (local_c8 + 0x20),SetPsbtString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_88,GetPsbtFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest> *)local_c8);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest> *)local_c8);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [5])"psbt",
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest> *)local_68);
    local_e8 = (_Base_ptr)pVar2.first._M_node;
    local_e0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"psbt",&local_109);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_108);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::function<std::__cxx11::string(cfd::js::api::json::VerifyPsbtSignRequest_const&)>::
    function<std::__cxx11::string(&)(cfd::js::api::json::VerifyPsbtSignRequest_const&),void>
              ((function<std::__cxx11::string(cfd::js::api::json::VerifyPsbtSignRequest_const&)> *)
               local_170,GetOutPointListString_abi_cxx11_);
    std::function<void(cfd::js::api::json::VerifyPsbtSignRequest&,UniValue_const&)>::
    function<void(&)(cfd::js::api::json::VerifyPsbtSignRequest&,UniValue_const&),void>
              ((function<void(cfd::js::api::json::VerifyPsbtSignRequest&,UniValue_const&)> *)
               (local_170 + 0x20),SetOutPointListString);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              (local_130,GetOutPointListFieldType_abi_cxx11_);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest> *)local_68,
               (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest> *)local_170);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest> *)local_170);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>>>>
            ::
            emplace<char_const(&)[13],cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>&>
                      ((map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>>>>
                        *)json_mapper_abi_cxx11_,(char (*) [13])"outPointList",
                       (CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest> *)local_68);
    local_180 = (_Base_ptr)pVar2.first._M_node;
    local_178 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"outPointList",&local_1a1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,(value_type *)local_1a0);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    core::CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest>::~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::js::api::json::VerifyPsbtSignRequest> *)local_68);
  }
  return;
}

Assistant:

void VerifyPsbtSignRequest::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<VerifyPsbtSignRequest> func_table;  // NOLINT

  func_table = {
    VerifyPsbtSignRequest::GetPsbtString,
    VerifyPsbtSignRequest::SetPsbtString,
    VerifyPsbtSignRequest::GetPsbtFieldType,
  };
  json_mapper.emplace("psbt", func_table);
  item_list.push_back("psbt");
  func_table = {
    VerifyPsbtSignRequest::GetOutPointListString,
    VerifyPsbtSignRequest::SetOutPointListString,
    VerifyPsbtSignRequest::GetOutPointListFieldType,
  };
  json_mapper.emplace("outPointList", func_table);
  item_list.push_back("outPointList");
}